

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O2

lzma_ret lzma_delta_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  lzma_ret lVar1;
  undefined4 *puVar2;
  
  if (props_size == 1) {
    puVar2 = (undefined4 *)lzma_alloc(0x28,allocator);
    if (puVar2 == (undefined4 *)0x0) {
      lVar1 = LZMA_MEM_ERROR;
    }
    else {
      *puVar2 = 0;
      puVar2[1] = *props + 1;
      *options = puVar2;
      lVar1 = LZMA_OK;
    }
    return lVar1;
  }
  return LZMA_OPTIONS_ERROR;
}

Assistant:

extern lzma_ret
lzma_delta_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size != 1)
		return LZMA_OPTIONS_ERROR;

	lzma_options_delta *opt
			= lzma_alloc(sizeof(lzma_options_delta), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	opt->type = LZMA_DELTA_TYPE_BYTE;
	opt->dist = props[0] + 1;

	*options = opt;

	return LZMA_OK;
}